

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegExecGetValues(xmlRegExecCtxtPtr exec,int err,int *nbval,int *nbneg,xmlChar **values,
                       int *terminal)

{
  int iVar1;
  int iVar2;
  xmlRegexpPtr pxVar3;
  xmlRegTrans *pxVar4;
  long lVar5;
  xmlRegStatePtr pxVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlChar *pxVar9;
  undefined8 uVar10;
  long lVar11;
  xmlRegCounter *pxVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  xmlRegStatePtr pxVar22;
  long lVar23;
  xmlGenericErrorFunc local_50;
  
  iVar15 = -1;
  if (((values != (xmlChar **)0x0 && nbneg != (int *)0x0) &&
       (nbval != (int *)0x0 && exec != (xmlRegExecCtxtPtr)0x0)) && (iVar1 = *nbval, 0 < iVar1)) {
    *nbval = 0;
    *nbneg = 0;
    pxVar3 = exec->comp;
    if ((pxVar3 == (xmlRegexpPtr)0x0) || (pxVar3->compact == (int *)0x0)) {
      if (terminal != (int *)0x0) {
        *terminal = (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
      }
      if (err == 0) {
        pxVar22 = exec->state;
      }
      else {
        pxVar22 = exec->errState;
      }
      if (pxVar22 != (xmlRegStatePtr)0x0) {
        iVar15 = 0;
        iVar13 = 0;
        if (0 < pxVar22->nbTrans) {
          lVar17 = 0x88;
          if (err == 0) {
            lVar17 = 0x40;
          }
          lVar23 = 0x10;
          lVar21 = 1;
          iVar13 = 0;
          do {
            pxVar4 = pxVar22->trans;
            lVar11 = (long)*(int *)((long)pxVar4 + lVar23 + -8);
            if (((lVar11 < 0) || (lVar5 = *(long *)((long)pxVar4 + lVar23 + -0x10), lVar5 == 0)) ||
               (pxVar9 = *(xmlChar **)(lVar5 + 0x18), pxVar9 == (xmlChar *)0x0)) goto LAB_001a77b5;
            iVar14 = *(int *)((long)&pxVar4->atom + lVar23);
            if (iVar14 == 0x123456) {
              pp_Var7 = __xmlGenericError();
              local_50 = *pp_Var7;
              ppvVar8 = __xmlGenericErrorContext();
              pvVar19 = *ppvVar8;
              uVar10 = 0x1110;
LAB_001a7710:
              (*local_50)(pvVar19,"Unimplemented block at %s:%d\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlregexp.c"
                          ,uVar10);
            }
            else {
              if (iVar14 == 0x123457) {
                pp_Var7 = __xmlGenericError();
                local_50 = *pp_Var7;
                ppvVar8 = __xmlGenericErrorContext();
                pvVar19 = *ppvVar8;
                uVar10 = 0x110d;
                goto LAB_001a7710;
              }
              lVar16 = (long)*(int *)((long)pxVar4 + lVar23 + -4);
              if (lVar16 < 0) {
                if (((exec->comp != (xmlRegexpPtr)0x0) &&
                    (pxVar6 = exec->comp->states[lVar11], pxVar6 != (xmlRegStatePtr)0x0)) &&
                   (pxVar6->type != XML_REGEXP_SINK_STATE)) {
                  if (*(int *)(lVar5 + 0x28) != 0) {
                    pxVar9 = *(xmlChar **)(lVar5 + 0x20);
                  }
                  values[iVar13] = pxVar9;
                  goto LAB_001a77ac;
                }
              }
              else {
                if (exec->comp == (xmlRegexpPtr)0x0) {
                  pxVar12 = (xmlRegCounter *)0x0;
                }
                else {
                  pxVar12 = exec->comp->counters + lVar16;
                }
                if ((pxVar12 == (xmlRegCounter *)0x0) ||
                   (*(int *)(*(long *)((long)&exec->status + lVar17) + lVar16 * 4) < pxVar12->max))
                {
                  if (*(int *)(lVar5 + 0x28) != 0) {
                    pxVar9 = *(xmlChar **)(lVar5 + 0x20);
                  }
                  values[iVar13] = pxVar9;
LAB_001a77ac:
                  iVar13 = iVar13 + 1;
                  *nbval = *nbval + 1;
                }
              }
            }
LAB_001a77b5:
            if (pxVar22->nbTrans <= lVar21) break;
            lVar23 = lVar23 + 0x18;
            lVar21 = lVar21 + 1;
          } while (iVar13 < iVar1);
        }
        if (iVar13 < iVar1 && 0 < pxVar22->nbTrans) {
          lVar17 = 0x10;
          lVar21 = 1;
          do {
            pxVar4 = pxVar22->trans;
            lVar23 = (long)*(int *)((long)pxVar4 + lVar17 + -8);
            if (((((-1 < lVar23) && (lVar11 = *(long *)((long)pxVar4 + lVar17 + -0x10), lVar11 != 0)
                  ) && (pxVar9 = *(xmlChar **)(lVar11 + 0x18), pxVar9 != (xmlChar *)0x0)) &&
                (((*(uint *)((long)&pxVar4->atom + lVar17) & 0xfffffffe) != 0x123456 &&
                 (*(int *)((long)pxVar4 + lVar17 + -4) < 0)))) &&
               ((pxVar6 = exec->comp->states[lVar23], pxVar6 != (xmlRegStatePtr)0x0 &&
                (pxVar6->type == XML_REGEXP_SINK_STATE)))) {
              if (*(int *)(lVar11 + 0x28) != 0) {
                pxVar9 = *(xmlChar **)(lVar11 + 0x20);
              }
              values[iVar13] = pxVar9;
              iVar13 = iVar13 + 1;
              *nbneg = *nbneg + 1;
            }
            if (pxVar22->nbTrans <= lVar21) {
              return 0;
            }
            lVar17 = lVar17 + 0x18;
            lVar21 = lVar21 + 1;
          } while (iVar13 < iVar1);
        }
      }
    }
    else {
      if (err == 0) {
        iVar13 = exec->index;
      }
      else {
        iVar13 = exec->errStateNo;
        if (iVar13 == -1) {
          return -1;
        }
      }
      if (terminal != (int *)0x0) {
        *terminal = (uint)(pxVar3->compact[(long)iVar13 * ((long)pxVar3->nbstrings + 1)] == 2);
      }
      uVar20 = (ulong)(uint)pxVar3->nbstrings;
      iVar15 = 0;
      iVar14 = 0;
      if (0 < pxVar3->nbstrings) {
        lVar17 = 0;
        iVar14 = 0;
        do {
          iVar18 = (int)uVar20 + 1;
          iVar2 = pxVar3->compact[iVar18 * iVar13 + lVar17 + 1];
          if (((0 < iVar2) && (iVar2 <= pxVar3->nbstates)) &&
             (pxVar3->compact[(iVar2 + -1) * iVar18] != 4)) {
            lVar21 = (long)iVar14;
            iVar14 = iVar14 + 1;
            values[lVar21] = pxVar3->stringMap[lVar17];
            *nbval = *nbval + 1;
          }
          lVar17 = lVar17 + 1;
          uVar20 = (ulong)pxVar3->nbstrings;
        } while ((lVar17 < (long)uVar20) && (iVar14 < iVar1));
      }
      uVar20 = (ulong)(uint)pxVar3->nbstrings;
      if (iVar14 < iVar1 && 0 < pxVar3->nbstrings) {
        lVar17 = 0;
        iVar15 = 0;
        do {
          iVar18 = (int)uVar20 + 1;
          iVar2 = pxVar3->compact[iVar18 * iVar13 + lVar17 + 1];
          if (((0 < iVar2) && (iVar2 <= pxVar3->nbstates)) &&
             (pxVar3->compact[(iVar2 + -1) * iVar18] == 4)) {
            lVar21 = (long)iVar14;
            iVar14 = iVar14 + 1;
            values[lVar21] = pxVar3->stringMap[lVar17];
            *nbneg = *nbneg + 1;
          }
          lVar17 = lVar17 + 1;
          uVar20 = (ulong)pxVar3->nbstrings;
        } while ((lVar17 < (long)uVar20) && (iVar14 < iVar1));
      }
    }
  }
  return iVar15;
}

Assistant:

static int
xmlRegExecGetValues(xmlRegExecCtxtPtr exec, int err,
                    int *nbval, int *nbneg,
		    xmlChar **values, int *terminal) {
    int maxval;
    int nb = 0;

    if ((exec == NULL) || (nbval == NULL) || (nbneg == NULL) ||
        (values == NULL) || (*nbval <= 0))
        return(-1);

    maxval = *nbval;
    *nbval = 0;
    *nbneg = 0;
    if ((exec->comp != NULL) && (exec->comp->compact != NULL)) {
        xmlRegexpPtr comp;
	int target, i, state;

        comp = exec->comp;

	if (err) {
	    if (exec->errStateNo == -1) return(-1);
	    state = exec->errStateNo;
	} else {
	    state = exec->index;
	}
	if (terminal != NULL) {
	    if (comp->compact[state * (comp->nbstrings + 1)] ==
	        XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] !=
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbval)++;
	    }
	}
	for (i = 0;(i < comp->nbstrings) && (nb < maxval);i++) {
	    target = comp->compact[state * (comp->nbstrings + 1) + i + 1];
	    if ((target > 0) && (target <= comp->nbstates) &&
	        (comp->compact[(target - 1) * (comp->nbstrings + 1)] ==
		 XML_REGEXP_SINK_STATE)) {
	        values[nb++] = comp->stringMap[i];
		(*nbneg)++;
	    }
	}
    } else {
        int transno;
	xmlRegTransPtr trans;
	xmlRegAtomPtr atom;
	xmlRegStatePtr state;

	if (terminal != NULL) {
	    if (exec->state->type == XML_REGEXP_FINAL_STATE)
		*terminal = 1;
	    else
		*terminal = 0;
	}

	if (err) {
	    if (exec->errState == NULL) return(-1);
	    state = exec->errState;
	} else {
	    if (exec->state == NULL) return(-1);
	    state = exec->state;
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        /* this should not be reached but ... */
	        TODO;
	    } else if (trans->counter >= 0) {
		xmlRegCounterPtr counter = NULL;
		int count;

		if (err)
		    count = exec->errCounts[trans->counter];
		else
		    count = exec->counts[trans->counter];
		if (exec->comp != NULL)
		    counter = &exec->comp->counters[trans->counter];
		if ((counter == NULL) || (count < counter->max)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    } else {
                if ((exec->comp != NULL) && (exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type !=
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbval)++;
		}
	    }
	}
	for (transno = 0;
	     (transno < state->nbTrans) && (nb < maxval);
	     transno++) {
	    trans = &state->trans[transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    if ((atom == NULL) || (atom->valuep == NULL))
		continue;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
	        continue;
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
	        continue;
	    } else if (trans->counter >= 0) {
	        continue;
	    } else {
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    if (atom->neg)
			values[nb++] = (xmlChar *) atom->valuep2;
		    else
			values[nb++] = (xmlChar *) atom->valuep;
		    (*nbneg)++;
		}
	    }
	}
    }
    return(0);
}